

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpstream.cpp
# Opt level: O1

void __thiscall TCPStream::~TCPStream(TCPStream *this)

{
  pointer pcVar1;
  
  close(this->m_sd);
  pcVar1 = (this->m_peerIP)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_peerIP).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

TCPStream::~TCPStream()
{
    close(m_sd);
}